

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O1

int adiak_job_size(void)

{
  int iVar1;
  
  iVar1 = adiak_namevalue("jobsize",2,"mpi","%u",1);
  return iVar1;
}

Assistant:

int adiak_job_size()
{
   int size = 1;

#if defined(USE_MPI)
   int result = -1;
   if (adiak_config->use_mpi) {
      result = adksys_jobsize(&size);
      if (result == -1)
         return -1;
   }
#endif
   return adiak_namevalue("jobsize", adiak_general, "mpi", "%u", size);
}